

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  double *pdVar1;
  ImVec2 IVar2;
  double dVar3;
  short sVar4;
  uint uVar5;
  ImGuiContext *pIVar6;
  ImGuiWindow *pIVar7;
  ImGuiViewportP *pIVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  ImGuiWindow *pIVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  ImGuiWindow *pIVar20;
  int iVar21;
  ImGuiWindow *pIVar22;
  ImGuiWindow *pIVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  
  pIVar6 = GImGui;
  pIVar7 = GImGui->MovingWindow;
  if (pIVar7 == (ImGuiWindow *)0x0) {
    pIVar8 = (ImGuiViewportP *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar8 = pIVar7->Viewport;
    pIVar7->Viewport = GImGui->MouseViewport;
    pIVar23 = (ImGuiWindow *)0x0;
    if ((pIVar7->Flags & 0x200) == 0) {
      pIVar23 = pIVar7;
    }
  }
  IVar2 = (pIVar6->Style).TouchExtraPadding;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = IVar2.x;
  auVar27._4_4_ = IVar2.y;
  if ((pIVar6->IO).ConfigWindowsResizeFromEdges == true) {
    auVar27 = maxps(auVar27,_DAT_00207180);
    lVar12 = auVar27._0_8_;
  }
  else {
    lVar12 = ((ulong)(uint)IVar2.y << 0x20) + ((ulong)IVar2 & 0xffffffff);
  }
  lVar14 = (long)(pIVar6->Windows).Size;
  if (lVar14 < 1) {
    pIVar16 = (ImGuiWindow *)0x0;
  }
  else {
    uVar15 = lVar14 + 1;
    pIVar16 = (ImGuiWindow *)0x0;
    do {
      pIVar22 = (pIVar6->Windows).Data[uVar15 - 2];
      if (((pIVar22->Active == true) && (pIVar22->Hidden == false)) &&
         (uVar5 = pIVar22->Flags, (uVar5 >> 9 & 1) == 0)) {
        if (pIVar22->Viewport == (ImGuiViewportP *)0x0) {
          __assert_fail("window->Viewport",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                        ,0x1220,"void FindHoveredWindow()");
        }
        if (pIVar22->Viewport == pIVar6->MouseViewport) {
          fVar17 = (float)lVar12;
          if ((uVar5 & 0x1000042) != 0) {
            fVar17 = IVar2.x;
          }
          fVar25 = (pIVar6->IO).MousePos.x;
          if ((pIVar22->OuterRectClipped).Min.x - fVar17 <= fVar25) {
            fVar18 = (float)((ulong)lVar12 >> 0x20);
            if ((uVar5 & 0x1000042) != 0) {
              fVar18 = IVar2.y;
            }
            fVar26 = (pIVar6->IO).MousePos.y;
            if ((((pIVar22->OuterRectClipped).Min.y - fVar18 <= fVar26) &&
                (fVar25 < fVar17 + (pIVar22->OuterRectClipped).Max.x)) &&
               (fVar26 < fVar18 + (pIVar22->OuterRectClipped).Max.y)) {
              sVar4 = (pIVar22->HitTestHoleSize).x;
              if (sVar4 != 0) {
                iVar19 = (int)(pIVar22->HitTestHoleOffset).x;
                fVar25 = fVar25 - (pIVar22->Pos).x;
                if ((float)iVar19 <= fVar25) {
                  iVar21 = (int)(pIVar22->HitTestHoleOffset).y;
                  fVar26 = fVar26 - (pIVar22->Pos).y;
                  if ((((float)iVar21 <= fVar26) && (fVar25 < (float)(iVar19 + sVar4))) &&
                     (fVar26 < (float)((pIVar22->HitTestHoleSize).y + iVar21))) goto LAB_001cf980;
                }
              }
              if (pIVar23 == (ImGuiWindow *)0x0) {
                pIVar23 = pIVar22;
              }
              pIVar20 = pIVar22;
              if (pIVar16 != (ImGuiWindow *)0x0) {
                pIVar20 = pIVar16;
              }
              if (((pIVar7 == (ImGuiWindow *)0x0) || (pIVar16 != (ImGuiWindow *)0x0)) ||
                 (pIVar20 = pIVar22, pIVar22->RootWindow != pIVar7->RootWindow)) {
                pIVar16 = pIVar20;
                if (pIVar23 != (ImGuiWindow *)0x0) {
                  pIVar6->HoveredWindow = pIVar23;
                  goto LAB_001cfaa2;
                }
                pIVar23 = (ImGuiWindow *)0x0;
              }
              else {
                pIVar16 = (ImGuiWindow *)0x0;
              }
            }
          }
        }
      }
LAB_001cf980:
      uVar15 = uVar15 - 1;
    } while (1 < uVar15);
  }
  pIVar6->HoveredWindow = pIVar23;
  if (pIVar23 == (ImGuiWindow *)0x0) {
    pIVar23 = (ImGuiWindow *)0x0;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  else {
LAB_001cfaa2:
    pIVar22 = pIVar23->RootWindow;
  }
  pIVar6->HoveredRootWindow = pIVar22;
  pIVar6->HoveredWindowUnderMovingWindow = pIVar16;
  if (pIVar7 != (ImGuiWindow *)0x0) {
    pIVar7->Viewport = pIVar8;
  }
  if ((pIVar23 != pIVar7 && pIVar23 != (ImGuiWindow *)0x0) &&
     (pIVar23->Viewport != pIVar6->MouseViewport)) {
    __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0xee5,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
  }
  pIVar7 = GetTopMostPopupModal();
  if (((pIVar7 != (ImGuiWindow *)0x0) && (pIVar22 != (ImGuiWindow *)0x0)) &&
     (pIVar22->RootWindow != pIVar7)) {
    do {
      if (pIVar22 == pIVar7) goto LAB_001cfb2d;
      pIVar22 = pIVar22->ParentWindow;
    } while (pIVar22 != (ImGuiWindow *)0x0);
    pIVar6->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar6->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar6->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
LAB_001cfb2d:
  uVar5 = (pIVar6->IO).ConfigFlags;
  if ((uVar5 & 0x10) != 0) {
    pIVar6->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar6->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar6->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  iVar19 = -1;
  lVar12 = 0;
  bVar9 = 0;
  do {
    if ((pIVar6->IO).MouseClicked[lVar12] == true) {
      bVar24 = true;
      if (pIVar23 == (ImGuiWindow *)0x0) {
        bVar24 = 0 < (pIVar6->OpenPopupStack).Size;
      }
      (pIVar6->IO).MouseDownOwned[lVar12] = bVar24;
    }
    bVar24 = (pIVar6->IO).MouseDown[lVar12];
    if ((bVar24 == true) &&
       ((iVar19 == -1 ||
        (dVar3 = (pIVar6->IO).MouseClickedTime[iVar19],
        pdVar1 = (pIVar6->IO).MouseClickedTime + lVar12, *pdVar1 <= dVar3 && dVar3 != *pdVar1)))) {
      iVar19 = (int)lVar12;
    }
    bVar9 = bVar9 & 1 | bVar24;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  if (iVar19 == -1) {
    bVar11 = 1;
  }
  else {
    bVar11 = (pIVar6->IO).MouseDownOwned[iVar19];
  }
  if (pIVar6->DragDropActive == true) {
    bVar13 = ((byte)pIVar6->DragDropSourceFlags & 0x10) >> 4;
  }
  else {
    bVar13 = 0;
  }
  if (bVar13 == 0 && (bVar11 & 1) == 0) {
    pIVar6->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar6->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar6->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  if (pIVar6->WantCaptureMouseNextFrame == -1) {
    bVar24 = true;
    if ((bVar11 & (pIVar23 != (ImGuiWindow *)0x0 || bVar9 != 0)) == 0) {
      bVar24 = 0 < (pIVar6->OpenPopupStack).Size;
    }
    (pIVar6->IO).WantCaptureMouse = bVar24;
  }
  else {
    (pIVar6->IO).WantCaptureMouse = pIVar6->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar6->WantCaptureKeyboardNextFrame == -1) {
    bVar24 = pIVar6->ActiveId != 0 || pIVar7 != (ImGuiWindow *)0x0;
  }
  else {
    bVar24 = pIVar6->WantCaptureKeyboardNextFrame != 0;
  }
  bVar10 = true;
  if ((pIVar6->IO).NavActive == false) {
    bVar10 = bVar24;
  }
  if ((uVar5 & 9) != 1) {
    bVar10 = bVar24;
  }
  (pIVar6->IO).WantCaptureKeyboard = bVar10;
  (pIVar6->IO).WantTextInput = pIVar6->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}